

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::SkipUntilNewline(AsciiParser *this)

{
  uint8_t uVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pSVar2 = this->_sr;
  uVar3 = pSVar2->length_;
  if (pSVar2->idx_ < uVar3) {
    uVar4 = pSVar2->idx_;
    while( true ) {
      uVar5 = uVar4 + 1;
      uVar1 = pSVar2->binary_[uVar4];
      if (uVar1 == '\0') break;
      pSVar2->idx_ = uVar5;
      if (uVar1 == '\r') {
        if (uVar5 < uVar3 - 1) {
          uVar1 = pSVar2->binary_[uVar5];
          pSVar2->idx_ = uVar4 + 2;
          if (uVar1 != '\n') {
            if (uVar3 < uVar5 || (long)(uVar4 + 2) < 1) {
              return false;
            }
            pSVar2->idx_ = uVar5;
          }
          break;
        }
      }
      else if (uVar1 == '\n') break;
      uVar4 = uVar5;
      if (uVar5 == uVar3) break;
    }
  }
  (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
  (this->_curr_cursor).col = 0;
  return true;
}

Assistant:

bool AsciiParser::SkipUntilNewline() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }

    } else {
      // continue
    }
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;
  return true;
}